

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
yy::parser::stack_symbol_type::stack_symbol_type(stack_symbol_type *this,stack_symbol_type *that)

{
  symbol_kind_type sVar1;
  stack_symbol_type *that_local;
  stack_symbol_type *this_local;
  
  basic_symbol<yy::parser::by_state>::basic_symbol
            (&this->super_basic_symbol<yy::parser::by_state>,
             (that->super_basic_symbol<yy::parser::by_state>).super_by_state.state,
             &(that->super_basic_symbol<yy::parser::by_state>).location);
  sVar1 = by_state::kind((by_state *)that);
  if ((sVar1 != S_IDENTIFIER) && (sVar1 != S_BRACKET_ARGUMENT)) {
    if (sVar1 == S_REF_OPEN) {
      value_type::move<ReferenceType>
                (&(this->super_basic_symbol<yy::parser::by_state>).value,
                 &(that->super_basic_symbol<yy::parser::by_state>).value);
      goto LAB_00107cfb;
    }
    if (2 < (uint)(sVar1 + ~S_REF_CLOSE)) {
      if (((((uint)(sVar1 + ~S_29_3) < 3) || ((uint)(sVar1 + ~S_argument) < 2)) ||
          (sVar1 == S_unquoted_argument)) || ((uint)(sVar1 + ~S_unquoted_element) < 2)) {
        value_type::move<unsigned_long>
                  (&(this->super_basic_symbol<yy::parser::by_state>).value,
                   &(that->super_basic_symbol<yy::parser::by_state>).value);
      }
      goto LAB_00107cfb;
    }
  }
  value_type::move<std::__cxx11::string>
            (&(this->super_basic_symbol<yy::parser::by_state>).value,
             &(that->super_basic_symbol<yy::parser::by_state>).value);
LAB_00107cfb:
  (that->super_basic_symbol<yy::parser::by_state>).super_by_state.state = '\0';
  return;
}

Assistant:

parser::stack_symbol_type::stack_symbol_type (YY_RVREF (stack_symbol_type) that)
    : super_type (YY_MOVE (that.state), YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_REF_OPEN: // "reference opening"
        value.YY_MOVE_OR_COPY< ReferenceType > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_arguments: // arguments
      case symbol_kind::S_argument_list: // argument_list
      case symbol_kind::S_parenthesized_arguments: // parenthesized_arguments
      case symbol_kind::S_quoted_argument: // quoted_argument
      case symbol_kind::S_quoted_element_list: // quoted_element_list
      case symbol_kind::S_unquoted_argument: // unquoted_argument
      case symbol_kind::S_reference: // reference
      case symbol_kind::S_var_reference_list: // var_reference_list
        value.YY_MOVE_OR_COPY< std::size_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "command name"
      case symbol_kind::S_BRACKET_ARGUMENT: // "bracket argument"
      case symbol_kind::S_REF_VAR_NAME: // "variable name"
      case symbol_kind::S_QUOTED_STR: // "quoted argument chars"
      case symbol_kind::S_UNQUOTED_STR: // "unquoted argument chars"
        value.YY_MOVE_OR_COPY< std::string > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

#if 201103L <= YY_CPLUSPLUS
    // that is emptied.
    that.state = empty_state;
#endif
  }